

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_fruinfo.c
# Opt level: O2

void IpmiFruBuildProductInfoArea(EeePSystemInfo_t *info)

{
  EeePSystemInfo_t *base;
  char *pcVar1;
  uint8_t *puVar2;
  
  product_info_area.area.format_version = '\x01';
  product_info_area.area.language_code = '\x19';
  base = info + 1;
  pcVar1 = GetSmbiosString(info->Manufacturer,base);
  if (pcVar1 == (char *)0x0) {
    product_info_area.area.variable_part[0] = 0xc0;
    puVar2 = product_info_area.pad;
  }
  else {
    puVar2 = IpmiFruAddString(product_info_area.area.variable_part,pcVar1);
  }
  pcVar1 = GetSmbiosString(info->ProductName,base);
  if (pcVar1 == (char *)0x0) {
    *puVar2 = 0xc0;
    puVar2 = puVar2 + 1;
  }
  else {
    puVar2 = IpmiFruAddString(puVar2,pcVar1);
  }
  *puVar2 = 0xc0;
  pcVar1 = GetSmbiosString(info->Version,base);
  if (pcVar1 == (char *)0x0) {
    puVar2[1] = 0xc0;
    puVar2 = puVar2 + 2;
  }
  else {
    puVar2 = IpmiFruAddString(puVar2 + 1,pcVar1);
  }
  pcVar1 = GetSmbiosString(info->SerialNumber,base);
  if (pcVar1 == (char *)0x0) {
    *puVar2 = 0xc0;
    puVar2 = puVar2 + 1;
  }
  else {
    puVar2 = IpmiFruAddString(puVar2,pcVar1);
  }
  pcVar1 = GetSmbiosString(info->SKU_Number,base);
  if (pcVar1 == (char *)0x0) {
    *puVar2 = 0xc0;
    puVar2 = puVar2 + 1;
  }
  else {
    puVar2 = IpmiFruAddString(puVar2,pcVar1);
  }
  *puVar2 = 0xc0;
  puVar2 = puVar2 + 1;
  pcVar1 = GetSmbiosString(info->Family,base);
  if (pcVar1 != (char *)0x0) {
    puVar2 = IpmiFruAddCustomString(puVar2,"FAMILY",pcVar1);
  }
  product_info_area_size = IpmiFruFinalizeArea((uint8_t *)&product_info_area,(int)puVar2 - 0x106164)
  ;
  return;
}

Assistant:

void IpmiFruBuildProductInfoArea(EeePSystemInfo_t *info)
{
    product_info_area.area.format_version = IPMI_FRUINFO_FORMAT_VERSION;
    product_info_area.area.language_code = IPMI_FRUINFO_LANGUAGE_CODE_ENGLISH;
    uint8_t *varp = product_info_area.area.variable_part;

    void *strstart = info + 1;
    const char *str;
    //  Manufacturer
    if (str = GetSmbiosString(info->Manufacturer, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Product name
    if (str = GetSmbiosString(info->ProductName, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Model/Part number - not specified
    *varp++ = 0xC0;
    //  Version
    if (str = GetSmbiosString(info->Version, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Serial number
    if (str = GetSmbiosString(info->SerialNumber, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  Asset tag - use SKU number
    if (str = GetSmbiosString(info->SKU_Number, strstart)) {
        varp = IpmiFruAddString(varp, str);
    } else {
        *varp++ = 0xC0;
    }
    //  FRU File ID - not specified
    *varp++ = 0xC0;
    //  Family as custom string
    if (str = GetSmbiosString(info->Family, strstart)) {
        varp = IpmiFruAddCustomString(varp, "FAMILY", str);
    }
    uint8_t *product_area_ptr = (uint8_t *)&product_info_area;
    product_info_area_size = IpmiFruFinalizeArea(product_area_ptr, varp-product_area_ptr);
}